

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O1

int aura_start_call_raw(aura_node *node,int id,
                       _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb,void *arg,
                       ...)

{
  char in_AL;
  int iVar1;
  aura_object *o;
  aura_buffer *buf;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b8 = in_R8;
  local_b0 = in_R9;
  o = aura_etable_find_id(node->tbl,id);
  if (o == (aura_object *)0x0) {
    iVar1 = -0x39;
  }
  else {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_f8.gp_offset = 0x20;
    local_f8.fp_offset = 0x30;
    buf = aura_serialize(node,o->arg_fmt,o->arglen,&local_f8);
    if (buf == (aura_buffer *)0x0) {
      iVar1 = -0x3d;
    }
    else {
      iVar1 = aura_core_start_call(node,o,calldonecb,arg,buf);
      if (iVar1 != 0) {
        aura_buffer_release(buf);
      }
    }
  }
  return iVar1;
}

Assistant:

int aura_start_call_raw(
	struct aura_node *node,
	int id,
	void (*calldonecb)(struct aura_node *dev, int status, struct aura_buffer *ret, void *arg),
	void *arg,
	...)
{
	va_list ap;
	struct aura_buffer *buf;
	int ret;

	struct aura_object *o = aura_etable_find_id(node->tbl, id);

	if (!o)
		return -EBADSLT;

	va_start(ap, arg);
	buf = aura_serialize(node, o->arg_fmt, o->arglen, ap);
	va_end(ap);

	if (!buf)
		return -ENODATA;

	ret = aura_core_start_call(node, o, calldonecb, arg, buf);

	if (ret != 0)
		aura_buffer_release(buf);

	return ret;
}